

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O2

void Bac_ManWriteVerilog(char *pFileName,Bac_Man_t *p,int fUseAssign)

{
  Vec_Str_t **p_00;
  void *pvVar1;
  void *pvVar2;
  Vec_Str_t *pVVar3;
  char *pStr;
  FILE *__s;
  long lVar4;
  long lVar5;
  
  pvVar1 = p->pMioLib;
  if (pvVar1 != (void *)0x0) {
    pvVar2 = Abc_FrameReadLibGen();
    if (pvVar1 != pvVar2) {
      puts("Genlib library used in the mapped design is not longer a current library.");
      return;
    }
  }
  pVVar3 = Vec_StrAlloc(10000);
  p_00 = &p->vOut;
  p->vOut = pVVar3;
  pVVar3 = Vec_StrAlloc(1000);
  p->vOut2 = pVVar3;
  Vec_StrPrintStr(p->vOut,"// Design \"");
  Vec_StrPrintStr(p->vOut,p->pName);
  Vec_StrPrintStr(p->vOut,"\" written via CBA package in ABC on ");
  pVVar3 = p->vOut;
  pStr = Extra_TimeStamp();
  Vec_StrPrintStr(pVVar3,pStr);
  Vec_StrPrintStr(p->vOut,"\n\n");
  Bac_ManAssignInternWordNames(p);
  lVar5 = 0xd0;
  for (lVar4 = 1; lVar4 <= p->nNtks; lVar4 = lVar4 + 1) {
    Bac_ManWriteVerilogNtk((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar5),fUseAssign);
    lVar5 = lVar5 + 0xd0;
  }
  if ((*p_00 != (Vec_Str_t *)0x0) && (0 < (*p_00)->nSize)) {
    __s = fopen(pFileName,"wb");
    if (__s == (FILE *)0x0) {
      printf("Cannot open file \"%s\" for writing.\n",pFileName);
    }
    else {
      fwrite((*p_00)->pArray,1,(long)(*p_00)->nSize,__s);
      fclose(__s);
    }
  }
  Vec_StrFreeP(p_00);
  Vec_StrFreeP(&p->vOut2);
  return;
}

Assistant:

void Bac_ManWriteVerilog( char * pFileName, Bac_Man_t * p, int fUseAssign )
{
    Bac_Ntk_t * pNtk; int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    // derive the stream
    p->vOut = Vec_StrAlloc( 10000 );
    p->vOut2 = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( p->vOut, "// Design \"" );
    Vec_StrPrintStr( p->vOut, Bac_ManName(p) );
    Vec_StrPrintStr( p->vOut, "\" written via CBA package in ABC on " );
    Vec_StrPrintStr( p->vOut, Extra_TimeStamp() );
    Vec_StrPrintStr( p->vOut, "\n\n" );
    Bac_ManAssignInternWordNames( p );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManWriteVerilogNtk( pNtk, fUseAssign );
    // dump into file
    if ( p->vOut && Vec_StrSize(p->vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(p->vOut), 1, Vec_StrSize(p->vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFreeP( &p->vOut );
    Vec_StrFreeP( &p->vOut2 );
}